

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testresult.cpp
# Opt level: O0

void __thiscall trun::TestResult::TestResult(TestResult *this,string *use_symbolName)

{
  string *use_symbolName_local;
  TestResult *this_local;
  
  trun::AssertError::AssertError(&this->assertError);
  std::__cxx11::string::string((string *)&this->errorString);
  this->failState = None;
  this->testResult = kTestResult_NotExecuted;
  this->tElapsedSec = 0.0;
  this->numError = 0;
  this->numAssert = 0;
  std::__cxx11::string::string((string *)&this->symbolName);
  this->testResult = kTestResult_NotExecuted;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->symbolName,use_symbolName);
  this->numAssert = 0;
  this->numError = 0;
  return;
}

Assistant:

TestResult::TestResult(const std::string &use_symbolName) {
    testResult = kTestResult_NotExecuted;
    symbolName = use_symbolName;
    numError = numAssert = 0;
}